

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::eagerlyCompile(Compiler *this,uint64_t id,uint eagerness)

{
  Own<capnp::compiler::Compiler::Impl,_std::nullptr_t> *this_00;
  Impl *this_01;
  undefined1 local_30 [28];
  uint eagerness_local;
  uint64_t id_local;
  Compiler *this_local;
  
  local_30._20_4_ = eagerness;
  unique0x10000089 = (Disposer *)id;
  id_local = (uint64_t)this;
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_30,
             &this->impl);
  this_00 = kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::operator->
                      ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_30
                      );
  this_01 = kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>::get(this_00);
  Impl::eagerlyCompile(this_01,(uint64_t)stack0xffffffffffffffe8,local_30._20_4_,&this->loader);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)local_30);
  return;
}

Assistant:

void Compiler::eagerlyCompile(uint64_t id, uint eagerness) const {
  impl.lockExclusive()->get()->eagerlyCompile(id, eagerness, loader);
}